

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * f3_get_stem_contributions_d2
                (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  undefined2 uVar1;
  short sVar2;
  uint j_00;
  int iVar3;
  vrna_param_t *p;
  code *pcVar4;
  code *pcVar5;
  char **ptype_00;
  short *psVar6;
  char *pcVar7;
  vrna_sc_t *pvVar8;
  short **ppsVar9;
  uint **ppuVar10;
  uchar uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  void *pvVar18;
  int *piVar19;
  void *__ptr;
  int local_e8;
  int local_dc;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int maxdist;
  int *stems;
  int *c;
  int turn;
  int max_j;
  int j;
  int energy;
  uint **a2s;
  uint length;
  uint type;
  uint n_seq;
  uint s;
  short *si;
  short *s5i1;
  short sj1;
  short si1;
  short *S1;
  short **S3;
  short **S5;
  short **S;
  char **ptype;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  j_00 = fc->length;
  iVar16 = fc->window_size;
  p = fc->params;
  lVar17 = *(long *)((fc->matrices->field_2).field_0.c + (long)i * 2) + (long)i * -4;
  iVar15 = (p->model_details).min_loop_size;
  pvVar18 = vrna_alloc(iVar16 * 4 + 0x18);
  piVar19 = (int *)((long)pvVar18 + (long)i * -4);
  pcVar4 = (code *)sc_wrapper->decomp_stem;
  pcVar5 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    ptype_00 = fc->ptype_local;
    psVar6 = (fc->field_23).field_0.sequence_encoding;
    if (i < 2) {
      sVar2 = -1;
    }
    else {
      sVar2 = psVar6[i + -1];
    }
    if ((int)(j_00 - 1) < i + iVar16) {
      local_dc = j_00 - 1;
    }
    else {
      local_dc = i + iVar16;
    }
    turn = i + iVar15;
    while (iVar14 = turn, turn = iVar14 + 1, turn <= local_dc) {
      piVar19[turn] = 10000000;
      if ((*(int *)(lVar17 + (long)turn * 4) != 10000000) &&
         (uVar11 = (*evaluate)(i,j_00,turn,iVar14 + 2,'\x10',hc_dat_local), uVar11 != '\0')) {
        uVar12 = vrna_get_ptype_window(i,turn,ptype_00);
        iVar3 = *(int *)(lVar17 + (long)turn * 4);
        iVar14 = vrna_E_ext_stem(uVar12,(int)sVar2,(int)psVar6[iVar14 + 2],p);
        piVar19[turn] = iVar3 + iVar14;
      }
    }
    if (pcVar4 != (code *)0x0) {
      turn = i + iVar15;
      while (iVar15 = turn, turn = iVar15 + 1, turn <= local_dc) {
        if (piVar19[turn] != 10000000) {
          iVar15 = (*pcVar4)(i,turn,iVar15 + 2,sc_wrapper);
          piVar19[turn] = iVar15 + piVar19[turn];
        }
      }
    }
    if (((j_00 <= (uint)(i + iVar16)) &&
        (piVar19[(int)j_00] = 10000000, *(int *)(lVar17 + (long)(int)j_00 * 4) != 10000000)) &&
       (uVar11 = (*evaluate)(i,j_00,i,j_00,'\x0e',hc_dat_local), uVar11 != '\0')) {
      uVar12 = vrna_get_ptype_window(i,j_00,ptype_00);
      iVar16 = *(int *)(lVar17 + (long)(int)j_00 * 4);
      iVar15 = vrna_E_ext_stem(uVar12,(int)sVar2,-1,p);
      piVar19[(int)j_00] = iVar16 + iVar15;
      if (pcVar5 != (code *)0x0) {
        iVar16 = (*pcVar5)(i,i,j_00,sc_wrapper);
        piVar19[(int)j_00] = iVar16 + piVar19[(int)j_00];
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar12 = (fc->field_23).field_1.n_seq;
    pcVar7 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar8 = (fc->field_23).field_0.sc;
    ppsVar9 = (fc->field_23).field_1.S3;
    ppuVar10 = (fc->field_23).field_1.a2s;
    if ((int)(j_00 - 1) < i + iVar16) {
      local_e8 = j_00 - 1;
    }
    else {
      local_e8 = i + iVar16;
    }
    pvVar18 = vrna_alloc(uVar12 << 1);
    __ptr = vrna_alloc(uVar12 << 1);
    for (type = 0; type < uVar12; type = type + 1) {
      if (ppuVar10[type][i] < 2) {
        uVar1 = 0xffff;
      }
      else {
        uVar1 = *(undefined2 *)(*(long *)(&pvVar8->type + (ulong)type * 2) + (long)i * 2);
      }
      *(undefined2 *)((long)pvVar18 + (ulong)type * 2) = uVar1;
      *(undefined2 *)((long)__ptr + (ulong)type * 2) =
           *(undefined2 *)(*(long *)(pcVar7 + (ulong)type * 8) + (long)i * 2);
    }
    turn = i + iVar15;
    while (iVar14 = turn, turn = iVar14 + 1, turn <= local_e8) {
      piVar19[turn] = 10000000;
      if ((*(int *)(lVar17 + (long)turn * 4) != 10000000) &&
         (uVar11 = (*evaluate)(i,j_00,turn,iVar14 + 2,'\x10',hc_dat_local), uVar11 != '\0')) {
        max_j = *(int *)(lVar17 + (long)turn * 4);
        for (type = 0; type < uVar12; type = type + 1) {
          uVar13 = vrna_get_ptype_md((int)*(short *)((long)__ptr + (ulong)type * 2),
                                     (int)*(short *)(*(long *)(pcVar7 + (ulong)type * 8) +
                                                    (long)turn * 2),&p->model_details);
          if (ppuVar10[type][turn] < ppuVar10[type][j_00]) {
            sVar2 = ppsVar9[type][turn];
          }
          else {
            sVar2 = -1;
          }
          iVar14 = vrna_E_ext_stem(uVar13,(int)*(short *)((long)pvVar18 + (ulong)type * 2),
                                   (int)sVar2,p);
          max_j = iVar14 + max_j;
        }
        piVar19[turn] = max_j;
      }
    }
    if (pcVar4 != (code *)0x0) {
      turn = i + iVar15;
      while (iVar15 = turn, turn = iVar15 + 1, turn <= local_e8) {
        if (piVar19[turn] != 10000000) {
          iVar15 = (*pcVar4)(i,turn,iVar15 + 2,sc_wrapper);
          piVar19[turn] = iVar15 + piVar19[turn];
        }
      }
    }
    if (((j_00 <= (uint)(i + iVar16)) &&
        (piVar19[(int)j_00] = 10000000, *(int *)(lVar17 + (long)(int)j_00 * 4) != 10000000)) &&
       (uVar11 = (*evaluate)(i,j_00,i,j_00,'\x0e',hc_dat_local), uVar11 != '\0')) {
      max_j = *(int *)(lVar17 + (long)(int)j_00 * 4);
      for (type = 0; type < uVar12; type = type + 1) {
        uVar13 = vrna_get_ptype_md((int)*(short *)((long)__ptr + (ulong)type * 2),
                                   (int)*(short *)(*(long *)(pcVar7 + (ulong)type * 8) +
                                                  (long)(int)j_00 * 2),&p->model_details);
        iVar16 = vrna_E_ext_stem(uVar13,(int)*(short *)((long)pvVar18 + (ulong)type * 2),-1,p);
        max_j = iVar16 + max_j;
      }
      if (pcVar5 != (code *)0x0) {
        iVar16 = (*pcVar5)(i,i,j_00,sc_wrapper);
        max_j = iVar16 + max_j;
      }
      piVar19[(int)j_00] = max_j;
    }
    free(pvVar18);
    free(__ptr);
  }
  return piVar19;
}

Assistant:

int *
f3_get_stem_contributions_d2(vrna_fold_compound_t       *fc,
                             int                        i,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f3       *sc_wrapper)
{
  char                    **ptype;
  short                   **S, **S5, **S3, *S1, si1, sj1, *s5i1, *si;
  unsigned int            s, n_seq, type, length, **a2s;
  int                     energy, j, max_j, turn, *c, *stems, maxdist;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f3_split_in_ext_stem *sc_spl_stem;
  sc_f3_reduce_to_stem    *sc_red_stem;

  length  = fc->length;
  maxdist = fc->window_size;
  P       = fc->params;
  md      = &(P->model_details);
  c       = fc->matrices->c_local[i];
  c       -= i;
  turn    = md->min_loop_size;

  stems = (int *)vrna_alloc(sizeof(int) * (maxdist + 6));
  stems -= i;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      ptype = fc->ptype_local;
      S1    = fc->sequence_encoding;
      si1   = (i > 1) ? S1[i - 1] : -1;
      max_j = MIN2((int)length - 1, i + maxdist);

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          type      = vrna_get_ptype_window(i, j, ptype);
          sj1       = S1[j + 1];
          stems[j]  = c[j] +
                      vrna_E_ext_stem(type, si1, sj1, P);
        }
      }

      if (sc_spl_stem)
        for (j = i + turn + 1; j <= max_j; j++)
          if (stems[j] != INF)
            stems[j] += sc_spl_stem(i, j, j + 1, sc_wrapper);

      if (length <= (unsigned int)(i + maxdist)) {
        j         = (int)length;
        stems[j]  = INF;

        if ((c[j] != INF) && (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
          type = vrna_get_ptype_window(i, j, ptype);

          stems[j] = c[j] +
                     vrna_E_ext_stem(type, si1, -1, P);

          if (sc_red_stem)
            stems[j] += sc_red_stem(i, i, j, sc_wrapper);
        }
      }

      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      n_seq = fc->n_seq;
      S     = fc->S;
      S5    = fc->S5;
      S3    = fc->S3;
      a2s   = fc->a2s;
      max_j = MIN2((int)length - 1, i + maxdist);

      s5i1  = (short *)vrna_alloc(sizeof(short) * n_seq);
      si    = (short *)vrna_alloc(sizeof(short) * n_seq);
      for (s = 0; s < n_seq; s++) {
        s5i1[s] = (a2s[s][i] > 1) ? S5[s][i] : -1;
        si[s]   = S[s][i];
      }

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          energy = c[j];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            sj1     = (a2s[s][j] < a2s[s][length]) ? S3[s][j] : -1;
            energy  += vrna_E_ext_stem(type, s5i1[s], sj1, P);
          }
          stems[j] = energy;
        }
      }

      if (sc_spl_stem)
        for (j = i + turn + 1; j <= max_j; j++)
          if (stems[j] != INF)
            stems[j] += sc_spl_stem(i, j, j + 1, sc_wrapper);

      if (length <= (unsigned int)(i + maxdist)) {
        j         = (int)length;
        stems[j]  = INF;

        if ((c[j] != INF) && (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
          energy = c[j];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, s5i1[s], -1, P);
          }

          if (sc_red_stem)
            energy += sc_red_stem(i, i, j, sc_wrapper);

          stems[j] = energy;
        }
      }

      free(s5i1);
      free(si);

      break;
  }

  return stems;
}